

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5SyncMethod(sqlite3_vtab *pVtab)

{
  int iVar1;
  _func_int_sqlite3_vtab_cursor_ptr *p_Var2;
  
  (pVtab[1].pModule)->xSavepoint = (_func_int_sqlite3_vtab_ptr_int *)&pVtab->zErrMsg;
  for (p_Var2 = (pVtab[2].pModule)->xNext; p_Var2 != (_func_int_sqlite3_vtab_cursor_ptr *)0x0;
      p_Var2 = *(_func_int_sqlite3_vtab_cursor_ptr **)(p_Var2 + 8)) {
    if ((*(int *)(p_Var2 + 0x20) == 1) && (*(sqlite3_vtab **)p_Var2 == pVtab)) {
      p_Var2[0x50] = (_func_int_sqlite3_vtab_cursor_ptr)((byte)p_Var2[0x50] | 0x20);
    }
  }
  iVar1 = sqlite3Fts5StorageSync((Fts5Storage *)pVtab[1].zErrMsg);
  (pVtab[1].pModule)->xSavepoint = (_func_int_sqlite3_vtab_ptr_int *)0x0;
  return iVar1;
}

Assistant:

static int fts5SyncMethod(sqlite3_vtab *pVtab){
  int rc;
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  fts5CheckTransactionState(pTab, FTS5_SYNC, 0);
  pTab->p.pConfig->pzErrmsg = &pTab->p.base.zErrMsg;
  fts5TripCursors(pTab);
  rc = sqlite3Fts5StorageSync(pTab->pStorage);
  pTab->p.pConfig->pzErrmsg = 0;
  return rc;
}